

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void change_special_filename(bool filename_is_code,string *filename)

{
  bool bVar1;
  undefined7 in_register_00000039;
  
  if (((int)CONCAT71(in_register_00000039,filename_is_code) == 0) &&
     (bVar1 = std::operator==(filename,"-"), !bVar1)) {
    return;
  }
  std::__cxx11::string::assign((char *)filename);
  return;
}

Assistant:

void change_special_filename(bool filename_is_code, std::string *filename)
{
    if (filename_is_code) {
        *filename = "<cmdline>";
    } else if (*filename == "-") {
        *filename = "<stdin>";
    }
}